

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> __thiscall
wabt::MakeUnique<wabt::GetAction,wabt::Location&>(wabt *this,Location *args)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  Location LStack_38;
  
  puVar4 = (undefined8 *)operator_new(0x98);
  *puVar4 = &PTR__Action_001e3b68;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[1] = (args->filename).data_;
  puVar4[2] = sVar1;
  puVar4[3] = sVar2;
  puVar4[4] = uVar3;
  LStack_38.field_1.field_0.line = 0;
  LStack_38.field_1._4_8_ = 0;
  LStack_38.filename.data_ = (char *)0x0;
  LStack_38.filename.size_._0_4_ = 0;
  LStack_38.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar4 + 5),0xffffffff,&LStack_38);
  puVar4[0xe] = puVar4 + 0x10;
  puVar4[0xf] = 0;
  *(undefined1 *)(puVar4 + 0x10) = 0;
  *(undefined4 *)(puVar4 + 0x12) = 1;
  *puVar4 = &PTR__Action_001e3b88;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::GetAction,_std::default_delete<wabt::GetAction>,_true,_true>)
         (__uniq_ptr_data<wabt::GetAction,_std::default_delete<wabt::GetAction>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}